

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.h
# Opt level: O2

VariableIndex __thiscall
cnn::ComputationGraph::add_function<cnn::PickNegLogSoftmax,unsigned_int&>
          (ComputationGraph *this,initializer_list<cnn::VariableIndex> *arguments,
          uint *side_information)

{
  PickNegLogSoftmax *this_00;
  uint *in_RCX;
  PickNegLogSoftmax *local_30;
  
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)(arguments->_M_len - (long)arguments->_M_array >> 3);
  this_00 = (PickNegLogSoftmax *)operator_new(0x88);
  PickNegLogSoftmax::PickNegLogSoftmax
            (this_00,(initializer_list<cnn::VariableIndex> *)side_information,*in_RCX);
  local_30 = this_00;
  std::vector<cnn::Node*,std::allocator<cnn::Node*>>::emplace_back<cnn::Node*>
            ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)arguments,(Node **)&local_30);
  set_dim_for_new_node((ComputationGraph *)arguments,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments,
                                              Args&&... side_information) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments, std::forward<Args>(side_information)...));
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}